

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::reserve
          (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *this,size_t n)

{
  memory_resource *pmVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar6;
  size_t sVar7;
  
  uVar5 = 4;
  if (this->ptr != (int *)0x0) {
    uVar5 = this->nAlloc;
  }
  if (uVar5 < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 4,4);
    paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)this->ptr;
    sVar3 = this->nStored;
    if (sVar3 != 0) {
      paVar6 = &this->field_2;
      if (paVar2 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                     *)0x0) {
        paVar6 = paVar2;
      }
      sVar7 = 0;
      do {
        ((int *)CONCAT44(extraout_var,iVar4))[sVar7] = paVar6->fixed[sVar7];
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,paVar2,this->nAlloc << 2,4);
    this->nAlloc = n;
    this->ptr = (int *)CONCAT44(extraout_var,iVar4);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }